

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::WorkerThread(I2cAnalyzer *this)

{
  U32 UVar1;
  AnalyzerChannelData *pAVar2;
  I2cAnalyzer *this_local;
  
  UVar1 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar1;
  this->mNeedAddress = true;
  std::auto_ptr<I2cAnalyzerSettings>::operator->(&this->mSettings);
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSda = pAVar2;
  std::auto_ptr<I2cAnalyzerSettings>::operator->(&this->mSettings);
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mScl = pAVar2;
  AdvanceToStartBit(this);
  AnalyzerChannelData::AdvanceToNextEdge();
  do {
    GetByte(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void I2cAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    mNeedAddress = true;

    mSda = GetAnalyzerChannelData( mSettings->mSdaChannel );
    mScl = GetAnalyzerChannelData( mSettings->mSclChannel );

    AdvanceToStartBit();
    mScl->AdvanceToNextEdge(); // now scl is low.

    for( ;; )
    {
        GetByte();
        CheckIfThreadShouldExit();
    }
}